

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_process_data_frame(nghttp2_session *session)

{
  int iVar1;
  nghttp2_frame *public_data_frame;
  int rv;
  nghttp2_session *session_local;
  
  session_local._4_4_ = nghttp2_session_on_data_received(session,&(session->iframe).frame);
  iVar1 = nghttp2_is_fatal(session_local._4_4_);
  if (iVar1 == 0) {
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

static int session_process_data_frame(nghttp2_session *session) {
  int rv;
  nghttp2_frame *public_data_frame = &session->iframe.frame;
  rv = nghttp2_session_on_data_received(session, public_data_frame);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }
  return 0;
}